

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

bool __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator!=
          (SubTypeIterator<glu::IsBasicType> *this,SubTypeIterator<glu::IsBasicType> *other)

{
  bool bVar1;
  
  if (this->m_type != other->m_type) {
    return true;
  }
  bVar1 = std::operator!=(&this->m_path,&other->m_path);
  return bVar1;
}

Assistant:

bool								operator!=			(const SubTypeIterator<IsExpanded>& other) const { return m_type != other.m_type || m_path != other.m_path; }